

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

int load_checkpoint(int idx)

{
  boolean bVar1;
  boolean bVar2;
  char local_138 [8];
  char namebuf [256];
  int local_28;
  boolean diff_invalid;
  boolean cmd_invalid;
  int ialign;
  int igend;
  int irace;
  int irole;
  int i;
  int playmode;
  int idx_local;
  
  bVar2 = loginfo.cmds_are_invalid;
  bVar1 = loginfo.diffs_are_invalid;
  if ((idx < 0) || (cpcount <= idx)) {
    playmode = -1;
  }
  else {
    loginfo.out_of_sync = '\0';
    i = idx;
    replay_end();
    freedynamicdata();
    replay_begin();
    replay_read_newgame(&turntime,&irole,local_138,&igend,&ialign,(int *)&stack0xffffffffffffffdc,
                        &local_28);
    fseek((FILE *)loginfo.flog,(long)checkpoints[i].nexttoken,0);
    program_state.restoring = 1;
    loginfo.diffs_are_invalid = bVar1;
    loginfo.cmds_are_invalid = bVar2;
    startup_common(local_138,irole);
    dorecover(&checkpoints[i].cpdata);
    checkpoints[i].cpdata.pos = 0;
    mfree(&diff_base);
    mnew(&diff_base,(memfile *)0x0);
    iflags.disable_log = '\x01';
    program_state.viewing = 1;
    program_state.game_running = 1;
    irace = 0;
    while (checkpoints[i].opt[irace].name != (char *)0x0) {
      nh_set_option(checkpoints[i].opt[irace].name,checkpoints[i].opt[irace].value,'\0');
      irace = irace + 1;
    }
    savegame(&diff_base);
    playmode = checkpoints[i].actions;
  }
  return playmode;
}

Assistant:

static int load_checkpoint(int idx)
{
    int playmode, i, irole, irace, igend, ialign;
    boolean cmd_invalid, diff_invalid;
    char namebuf[BUFSZ];
    
    if (idx < 0 || idx >= cpcount)
	return -1;
    
    cmd_invalid = loginfo.cmds_are_invalid;
    diff_invalid = loginfo.diffs_are_invalid;
    loginfo.out_of_sync = FALSE; /* we're destroying saved state anyway */

    replay_end();
    freedynamicdata();

    replay_begin();
    replay_read_newgame(&turntime, &playmode, namebuf,
			&irole, &irace, &igend, &ialign);
    fseek(loginfo.flog, checkpoints[idx].nexttoken, SEEK_SET);

    loginfo.cmds_are_invalid = cmd_invalid;
    loginfo.diffs_are_invalid = diff_invalid;

    program_state.restoring = TRUE;
    startup_common(namebuf, playmode);
    dorecover(&checkpoints[idx].cpdata);
    checkpoints[idx].cpdata.pos = 0;

    mfree(&diff_base);
    mnew(&diff_base, NULL);

    iflags.disable_log = TRUE;
    program_state.viewing = TRUE;
    program_state.game_running = TRUE;
    
    /* restore the full option state of the time of the checkpoint */
    for (i = 0; checkpoints[idx].opt[i].name; i++)
	nh_set_option(checkpoints[idx].opt[i].name, checkpoints[idx].opt[i].value, FALSE);

    savegame(&diff_base);

    return checkpoints[idx].actions;
}